

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O2

string * __thiscall
wabt::LoadStoreTracking::GenAccess_abi_cxx11_
          (string *__return_storage_ptr__,LoadStoreTracking *this,uint64_t offset,Node *addr_exp)

{
  const_iterator cVar1;
  const_iterator cVar2;
  Index index;
  char *pcVar3;
  string name;
  allocator local_41;
  uint64_t local_40;
  string local_38;
  
  local_40 = offset;
  AddrExpName_abi_cxx11_(&local_38,this,addr_exp);
  if (local_38._M_string_length == 0) {
LAB_0016b037:
    pcVar3 = "";
  }
  else {
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
                    *)this,&local_38);
    if ((_Rb_tree_header *)cVar1._M_node == &(this->vars)._M_t._M_impl.super__Rb_tree_header)
    goto LAB_0016b037;
    if (*(char *)&cVar1._M_node[3]._M_left == '\x01') {
      cVar2 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>,_std::_Select1st<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
              ::find(cVar1._M_node + 2,&local_40);
      if (cVar2._M_node == (_Base_ptr)&cVar1._M_node[2]._M_parent) {
        __assert_fail("ait != it->second.accesses.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler-ls.h"
                      ,0xf8,
                      "std::string wabt::LoadStoreTracking::GenAccess(uint64_t, const Node &) const"
                     );
      }
      IndexToAlphaName_abi_cxx11_
                (__return_storage_ptr__,
                 (wabt *)(ulong)*(uint *)((long)&cVar2._M_node[1]._M_left + 4),index);
      goto LAB_0016b04b;
    }
    if (*(int *)((long)&cVar1._M_node[3]._M_left + 4) == -0x40) goto LAB_0016b037;
    pcVar3 = "*";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_41);
LAB_0016b04b:
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string GenAccess(uint64_t offset, const Node& addr_exp) const {
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return "";
    }
    auto it = vars.find(name);
    if (it == vars.end()) {
      return "";
    }
    if (it->second.struct_layout) {
      auto ait = it->second.accesses.find(offset);
      assert (ait != it->second.accesses.end());
      return IdxToName(ait->second.idx);
    }
    // Not a struct, see if it is a typed pointer.
    if (it->second.same_type != Type::Void) {
      return "*";
    }
    return "";
  }